

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  stbrp_node *psVar4;
  stbrp_node *psVar5;
  stbrp_context *psVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  stbrp_node **ppsVar10;
  long lVar11;
  uint uVar12;
  int *piVar13;
  stbrp_node *psVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  stbrp_context *psVar18;
  stbrp_node **ppsVar19;
  ulong uVar20;
  stbrp_context *c;
  uint local_90;
  int local_8c;
  stbrp_node **local_88;
  int local_70;
  int waste;
  stbrp_rect *local_68;
  stbrp_node **local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  stbrp_rect *local_40;
  ulong local_38;
  
  uVar9 = 0;
  uVar20 = 0;
  if (0 < num_rects) {
    uVar20 = (ulong)(uint)num_rects;
  }
  piVar13 = &rects->was_packed;
  for (; uVar20 != uVar9; uVar9 = uVar9 + 1) {
    *piVar13 = (int)uVar9;
    piVar13 = piVar13 + 4;
  }
  local_58 = (size_t)num_rects;
  qsort(rects,local_58,0x10,rect_height_compare);
  local_60 = &context->active_head;
  local_68 = rects;
  local_50 = uVar20;
  for (uVar9 = 0; uVar9 != uVar20; uVar9 = uVar9 + 1) {
    psVar1 = rects + uVar9;
    uVar2 = rects[uVar9].w;
    if ((uVar2 == 0) || (uVar3 = psVar1->h, uVar3 == 0)) {
      psVar1->x = 0;
      psVar1->y = 0;
    }
    else {
      iVar15 = context->width;
      iVar17 = (uint)uVar2 + context->align + -1;
      iVar17 = iVar17 - iVar17 % context->align;
      c = (stbrp_context *)context->active_head;
      uVar16 = 0x40000000;
      local_88 = (stbrp_node **)0x0;
      local_8c = 0x40000000;
      psVar18 = c;
      ppsVar19 = local_60;
      local_48 = (ulong)uVar2;
      local_40 = psVar1;
      local_38 = uVar9;
      while( true ) {
        uVar2 = (ushort)psVar18->width;
        uVar12 = (uint)uVar3;
        if (iVar15 < (int)((uint)uVar2 + iVar17)) break;
        uVar7 = stbrp__skyline_find_min_y
                          (psVar18,(stbrp_node *)(ulong)uVar2,iVar17,(int)&waste,&context->width);
        if (context->heuristic == 0) {
          if ((int)uVar7 < (int)uVar16) {
            uVar16 = uVar7;
            local_88 = ppsVar19;
          }
        }
        else if (((int)(uVar12 + uVar7) <= context->height) &&
                (((int)uVar7 < (int)uVar16 || (waste < local_8c && uVar7 == uVar16)))) {
          local_8c = waste;
          uVar16 = uVar7;
          local_88 = ppsVar19;
        }
        ppsVar19 = (stbrp_node **)&psVar18->align;
        psVar18 = *(stbrp_context **)&psVar18->align;
      }
      if (local_88 == (stbrp_node **)0x0) {
        local_90 = 0;
      }
      else {
        local_90 = (uint)(*local_88)->x;
      }
      psVar18 = c;
      if (context->heuristic == 1) {
        while (ppsVar19 = local_60, (int)(uint)(ushort)psVar18->width < iVar17) {
          psVar18 = *(stbrp_context **)&psVar18->align;
        }
        for (; psVar18 != (stbrp_context *)0x0; psVar18 = *(stbrp_context **)&psVar18->align) {
          uVar7 = (uint)(ushort)psVar18->width - iVar17;
          psVar6 = c;
          do {
            c = psVar6;
            ppsVar10 = ppsVar19;
            ppsVar19 = (stbrp_node **)&c->align;
            psVar6 = *(stbrp_context **)&c->align;
          } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar7);
          uVar8 = stbrp__skyline_find_min_y
                            (c,(stbrp_node *)(ulong)uVar7,iVar17,(int)&local_70,&context->width);
          if ((((int)(uVar12 + uVar8) < context->height) && ((int)uVar8 <= (int)uVar16)) &&
             (((uVar8 < uVar16 || (local_70 < local_8c)) ||
              ((local_70 == local_8c && ((int)uVar7 < (int)local_90)))))) {
            local_8c = local_70;
            uVar16 = uVar8;
            local_90 = uVar7;
            local_88 = ppsVar10;
          }
          ppsVar19 = ppsVar10;
        }
      }
      rects = local_68;
      uVar9 = local_38;
      uVar20 = local_50;
      if (((local_88 == (stbrp_node **)0x0) || (context->height < (int)(uVar12 + uVar16))) ||
         (psVar4 = context->free_head, psVar4 == (stbrp_node *)0x0)) {
        local_40->x = 0xffff;
        local_40->y = 0xffff;
      }
      else {
        psVar4->x = (stbrp_coord)local_90;
        psVar4->y = (stbrp_coord)(uVar12 + uVar16);
        context->free_head = psVar4->next;
        psVar5 = *local_88;
        psVar14 = psVar5;
        if ((int)(uint)psVar5->x < (int)local_90) {
          psVar14 = psVar5->next;
          local_88 = &psVar5->next;
        }
        *local_88 = psVar4;
        iVar15 = local_90 + (int)local_48;
        while ((psVar5 = psVar14->next, psVar5 != (stbrp_node *)0x0 &&
               ((int)(uint)psVar5->x <= iVar15))) {
          psVar14->next = context->free_head;
          context->free_head = psVar14;
          psVar14 = psVar5;
        }
        psVar4->next = psVar14;
        if ((int)(uint)psVar14->x < iVar15) {
          psVar14->x = (stbrp_coord)iVar15;
        }
        local_40->x = (stbrp_coord)local_90;
        local_40->y = (stbrp_coord)uVar16;
      }
    }
  }
  qsort(rects,local_58,0x10,rect_original_order);
  for (lVar11 = 0; uVar20 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
    uVar16 = 1;
    if (*(short *)((long)&rects->x + lVar11) == -1) {
      uVar16 = (uint)(*(short *)((long)&rects->y + lVar11) != -1);
    }
    *(uint *)((long)&rects->was_packed + lVar11) = uVar16;
  }
  return (int)lVar11;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}